

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDDD.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChNodeFEAxyzDDD::NodeIntLoadResidual_F
          (ChNodeFEAxyzDDD *this,uint off,ChVectorDynamic<> *R,double c)

{
  uint uVar1;
  double *pdVar2;
  Index index;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  
  if ((long)(ulong)off <=
      (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3) {
    pdVar2 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
             off;
    uVar3 = 3;
    if ((((ulong)pdVar2 & 7) == 0) &&
       (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar4 < 3)) {
      uVar3 = uVar4;
    }
    if (uVar3 != 0) {
      uVar4 = 0;
      do {
        pdVar2[uVar4] =
             c * (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.Force.m_data
                 [uVar4] + pdVar2[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
    if (uVar3 < 3) {
      do {
        pdVar2[uVar3] =
             c * (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.Force.m_data
                 [uVar3] + pdVar2[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar3 != 3);
    }
    if ((long)(ulong)(off + 3) <=
        (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3) {
      pdVar2 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               + (off + 3);
      uVar5 = 3;
      if ((((ulong)pdVar2 & 7) == 0) &&
         (uVar1 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7, uVar1 < 3)) {
        uVar5 = uVar1;
      }
      if (uVar5 != 0) {
        memset(pdVar2,0,(ulong)(uVar5 * 8));
      }
      if (uVar5 < 3) {
        memset((void *)((long)pdVar2 + (ulong)(uVar5 << 3)),0,0x18 - (ulong)(uVar5 << 3));
      }
      if ((long)(ulong)(off + 6) <=
          (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3)
      {
        pdVar2 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data + (off + 6);
        uVar5 = 3;
        if ((((ulong)pdVar2 & 7) == 0) &&
           (uVar1 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7, uVar1 < 3)) {
          uVar5 = uVar1;
        }
        if (uVar5 != 0) {
          memset(pdVar2,0,(ulong)(uVar5 * 8));
        }
        if (uVar5 < 3) {
          memset((void *)((long)pdVar2 + (ulong)(uVar5 << 3)),0,0x18 - (ulong)(uVar5 << 3));
        }
        if ((long)(ulong)(off + 9) <=
            (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows +
            -3) {
          pdVar2 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data + (off + 9);
          uVar5 = 3;
          if ((((ulong)pdVar2 & 7) == 0) &&
             (uVar1 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7, uVar1 < 3)) {
            uVar5 = uVar1;
          }
          if (uVar5 != 0) {
            memset(pdVar2,0,(ulong)(uVar5 * 8));
          }
          if (uVar5 < 3) {
            memset((void *)((long)pdVar2 + (ulong)(uVar5 << 3)),0,0x18 - (ulong)(uVar5 << 3));
            return;
          }
          return;
        }
      }
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChNodeFEAxyzDDD::NodeIntLoadResidual_F(const unsigned int off, ChVectorDynamic<>& R, const double c) {
    R.segment(off + 0, 3) += c * Force.eigen();
    R.segment(off + 3, 3).setZero();  // TODO something about applied nodal torque..
    R.segment(off + 6, 3).setZero();  // TODO something about applied nodal torque..
	R.segment(off + 9, 3).setZero();  // TODO something about applied nodal torque..
}